

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O2

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar *puVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  undefined8 unaff_RBP;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = this->offset;
  puVar1 = this->first;
  uVar6 = ((long)this->last - (long)puVar1) * 8;
  if (uVar5 < uVar6) {
    this->streamError = NoError;
    uVar2 = 8 - ((uint)uVar5 & 7);
    uVar8 = ~(-1 << ((byte)uVar2 & 0x1f));
    bVar3 = puVar1[uVar5 >> 3] & (byte)uVar8;
    uVar7 = (uint)bVar3;
    if (bVar3 < uVar8) {
      *(uint *)CONCAT44(in_register_00000034,__fd) = (uint)bVar3;
      this->offset = uVar5 + uVar2;
    }
    else {
      uVar2 = uVar2 + (uint)uVar5;
      iVar4 = 0;
      do {
        if (uVar6 <= uVar2) goto LAB_001c9c8f;
        bVar3 = puVar1[uVar2 >> 3];
        if ((iVar4 == 0x1c) && (0xf < bVar3)) {
          local_38[0] = '\x02';
          local_38[1] = '\0';
          local_38[2] = '\0';
          local_38[3] = '\0';
          local_38[0x14] = '\0';
          local_38[0x15] = '\0';
          local_38[0x16] = '\0';
          local_38[0x17] = '\0';
          local_38[4] = '\0';
          local_38[5] = '\0';
          local_38[6] = '\0';
          local_38[7] = '\0';
          local_38[8] = '\0';
          local_38[9] = '\0';
          local_38[10] = '\0';
          local_38[0xb] = '\0';
          local_38[0xc] = '\0';
          local_38[0xd] = '\0';
          local_38[0xe] = '\0';
          local_38[0xf] = '\0';
          local_38[0x10] = '\0';
          local_38[0x11] = '\0';
          local_38[0x12] = '\0';
          local_38[0x13] = '\0';
          local_20 = "default";
          uVar5 = 0;
          QMessageLogger::critical(local_38,"integer is too big");
          this->streamError = InvalidInteger;
          goto LAB_001c9c98;
        }
        uVar7 = uVar7 + ((bVar3 & 0x7f) << ((byte)iVar4 & 0x1f));
        uVar2 = uVar2 + 8;
        iVar4 = iVar4 + 7;
      } while ((char)bVar3 < '\0');
      *(uint *)CONCAT44(in_register_00000034,__fd) = uVar7;
      this->offset = (ulong)uVar2;
    }
    uVar5 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  else {
LAB_001c9c8f:
    this->streamError = NotEnoughData;
    uVar5 = 0;
  }
LAB_001c9c98:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar5 & 0xffffffff;
  }
  __stack_chk_fail();
}

Assistant:

bool BitIStream::read(quint32 *dstPtr)
{
    Q_ASSERT(dstPtr);
    quint32 &dst = *dstPtr;

    // 5.1 Integer Representation
    //
    // Integers are used to represent name indexes, header field indexes, or string lengths.
    // An integer representation can start anywhere within an octet.
    // To allow for optimized processing, an integer representation always finishes at the end of an octet.
    // An integer is represented in two parts: a prefix that fills the current octet and an optional
    // list of octets that are used if the integer value does not fit within the prefix.
    // The number of bits of the prefix (called N) is a parameter of the integer representation.
    // If the integer value is small enough, i.e., strictly less than 2N-1, it is compressed within the N-bit prefix.
    // ...
    // The prefix size, N, is always between 1 and 8 bits. An integer
    // starting at an octet boundary will have an 8-bit prefix.

    // Technically, such integers can be of any size, but as we do not have arbitrary-long integers,
    // everything that does not fit into 'dst' we consider as an error (after all, try to allocate a string
    // of such size and ... hehehe - send it as a part of a header!

    // This function updates the offset _only_ if the read was successful.
    if (offset >= bitLength()) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    const quint32 prefixLen = 8 - offset % 8;
    const quint32 fullPrefix = (1 << prefixLen) - 1;

    const uchar prefix = uchar(first[offset / 8] & fullPrefix);
    if (prefix < fullPrefix) {
        // The number fitted into the prefix bits.
        dst = prefix;
        offset += prefixLen;
        return true;
    }

    quint32 newOffset = offset + prefixLen;
    // We have a list of bytes representing an integer ...
    quint64 val = prefix;
    quint32 octetPower = 0;

    while (true) {
        if (newOffset >= bitLength()) {
            setError(Error::NotEnoughData);
            return false;
        }

        const uchar octet = first[newOffset / 8];

        if (octetPower == 28 && octet > 15) {
            qCritical("integer is too big");
            setError(Error::InvalidInteger);
            return false;
        }

        val += quint32(octet & 0x7f) << octetPower;
        newOffset += 8;

        if (!(octet & 0x80)) {
            // The most significant bit of each octet is used
            // as a continuation flag: its value is set to 1
            // except for the last octet in the list.
            break;
        }

        octetPower += 7;
    }

    dst = val;
    offset = newOffset;
    Q_ASSERT(!(offset % 8));

    return true;
}